

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O3

int __thiscall FParseContext::GetToken(FParseContext *this,char **sourcep,FParseToken *yylval)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  int *piVar9;
  char cVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  int buildup;
  char token [80];
  int local_8c;
  undefined8 local_88;
  undefined1 local_39;
  
  pcVar8 = *sourcep;
  iVar7 = this->SourceLine;
LAB_0046dfde:
  *sourcep = pcVar8 + 1;
  cVar1 = *pcVar8;
  uVar11 = (uint)cVar1;
  iVar3 = isspace(uVar11);
  pcVar6 = pcVar8 + 1;
  while ((pcVar5 = pcVar6, cVar10 = (char)uVar11, cVar1 != '\0' && (iVar3 != 0))) {
    if (cVar10 == '\n') {
      iVar7 = iVar7 + 1;
      this->SourceLine = iVar7;
    }
    *sourcep = pcVar5 + 1;
    cVar1 = *pcVar5;
    uVar11 = (uint)cVar1;
    iVar3 = isspace(uVar11);
    pcVar6 = pcVar5 + 1;
    pcVar8 = pcVar5;
  }
  if (cVar10 == '\0') {
    return 0;
  }
  pcVar6 = pcVar8 + 1;
  if (uVar11 - 0x30 < 10) {
    if (cVar10 == '0') {
      *sourcep = pcVar8 + 2;
      pcVar5 = pcVar6;
      if ((pcVar8[1] & 0xdfU) == 0x58) {
        lVar12 = strtol(pcVar8 + 2,sourcep,0x10);
        yylval->val = (int)lVar12;
        return this->TokenTrans[9];
      }
    }
    *sourcep = pcVar5 + -1;
    lVar12 = strtol(pcVar5 + -1,(char **)&local_88,10);
    yylval->val = (int)lVar12;
    if (*(char *)CONCAT71(local_88._1_7_,(char)local_88) == '.') {
      dVar13 = strtod(*sourcep,sourcep);
      yylval->fval = dVar13;
      lVar12 = 0x28;
    }
    else {
      *sourcep = (char *)CONCAT71(local_88._1_7_,(char)local_88);
      lVar12 = 0x24;
    }
    return *(int *)((long)this->TokenTrans + lVar12);
  }
  iVar3 = isalpha(uVar11);
  if (iVar3 == 0) {
    uVar11 = uVar11 & 0xff;
    if (0x5a < uVar11) {
      if (0x7a < uVar11) {
        if (uVar11 == 0x7b) {
          return this->TokenTrans[0xf];
        }
        if (uVar11 == 0x7c) {
          *sourcep = pcVar8 + 2;
          if (pcVar8[1] != '=') {
            *sourcep = pcVar6;
            return this->TokenTrans[1];
          }
          return this->TokenTrans[0x14];
        }
        if (uVar11 == 0x7d) {
          return this->TokenTrans[0xe];
        }
        return 0;
      }
      if (uVar11 == 0x5b) {
        return this->TokenTrans[0x12];
      }
      if (uVar11 == 0x5d) {
        return this->TokenTrans[0x13];
      }
      if (uVar11 == 0x5e) {
        return this->TokenTrans[2];
      }
      return 0;
    }
    switch(uVar11) {
    case 0x22:
      uVar4 = 0;
      while( true ) {
        *sourcep = pcVar5 + 1;
        cVar1 = *pcVar5;
        if ((cVar1 == '\0') || (cVar1 == '\"')) break;
        yylval->sym[uVar4] = cVar1;
        uVar4 = uVar4 + 1;
        pcVar5 = *sourcep;
      }
      yylval->sym[uVar4 & 0xffffffff] = '\0';
      return this->TokenTrans[0x19];
    case 0x23:
      iVar7 = strncasecmp(pcVar6,"include",7);
      if (iVar7 == 0) {
        *sourcep = pcVar8 + 8;
        return this->TokenTrans[0x1a];
      }
      iVar7 = strncasecmp(pcVar6,"define",6);
      if (iVar7 == 0) {
        *sourcep = pcVar8 + 7;
        return this->TokenTrans[0x1b];
      }
      return 0;
    default:
      goto LAB_0046e499;
    case 0x25:
      return this->TokenTrans[8];
    case 0x26:
      return this->TokenTrans[3];
    case 0x28:
      return this->TokenTrans[0xb];
    case 0x29:
      return this->TokenTrans[0xc];
    case 0x2a:
      return this->TokenTrans[6];
    case 0x2b:
      return this->TokenTrans[5];
    case 0x2c:
      return this->TokenTrans[0x10];
    case 0x2d:
      return this->TokenTrans[4];
    case 0x2f:
      goto switchD_0046e092_caseD_2f;
    case 0x3a:
      return this->TokenTrans[0x15];
    case 0x3b:
      return this->TokenTrans[0x16];
    case 0x3c:
      *sourcep = pcVar8 + 2;
      if (pcVar8[1] != '<') {
        return 0;
      }
      *sourcep = pcVar8 + 3;
      if (pcVar8[2] == '=') {
        return this->TokenTrans[0x17];
      }
      break;
    case 0x3d:
      return this->TokenTrans[0x11];
    case 0x3e:
      *sourcep = pcVar8 + 2;
      if (pcVar8[1] != '>') {
        return 0;
      }
      *sourcep = pcVar8 + 3;
      if (pcVar8[2] == '=') {
        return this->TokenTrans[0x18];
      }
    }
    *sourcep = pcVar8 + 2;
LAB_0046e499:
    return 0;
  }
  local_8c = 0;
  lVar12 = 1;
  local_88._0_1_ = cVar10;
  goto LAB_0046e1d2;
switchD_0046e092_caseD_2f:
  pcVar5 = pcVar8 + 2;
  *sourcep = pcVar5;
  if (pcVar8[1] == '*') {
    while( true ) {
      while( true ) {
        pcVar6 = pcVar5 + 1;
        *sourcep = pcVar6;
        cVar1 = *pcVar5;
        if (cVar1 == '\0') {
          return 0;
        }
        if (cVar1 == '*') break;
        pcVar5 = pcVar6;
        if (cVar1 == '\n') {
          iVar7 = iVar7 + 1;
          this->SourceLine = iVar7;
        }
      }
      pcVar8 = pcVar5 + 2;
      *sourcep = pcVar8;
      if (*pcVar6 == '\0') {
        return 0;
      }
      if (*pcVar6 == '/') break;
      *sourcep = pcVar6;
      pcVar5 = pcVar6;
    }
  }
  else {
    if (pcVar8[1] != '/') {
      *sourcep = pcVar6;
      return this->TokenTrans[7];
    }
    do {
      pcVar8 = pcVar5 + 1;
      *sourcep = pcVar8;
      cVar1 = *pcVar5;
      if (cVar1 == '\0') goto LAB_0046dfde;
      pcVar5 = pcVar8;
    } while (cVar1 != '\n');
    iVar7 = iVar7 + 1;
    this->SourceLine = iVar7;
  }
  goto LAB_0046dfde;
  while( true ) {
    *(char *)((long)&local_88 + lVar12) = cVar1;
    lVar12 = lVar12 + 1;
    pcVar5 = pcVar8 + 1;
    if (lVar12 == 0x4f) break;
LAB_0046e1d2:
    pcVar8 = pcVar5;
    *sourcep = pcVar8 + 1;
    cVar1 = *pcVar8;
    iVar7 = isalnum((int)cVar1);
    if (iVar7 == 0 && cVar1 != 0x5f) {
      *(undefined1 *)((long)&local_88 + lVar12) = 0;
      goto LAB_0046e440;
    }
  }
  local_39 = 0;
  if (iVar7 != 0) {
    pcVar6 = pcVar8 + 2;
    do {
      pcVar8 = pcVar6;
      *sourcep = pcVar8;
      iVar7 = isalnum((int)pcVar8[-1]);
      pcVar6 = pcVar8 + 1;
    } while (iVar7 != 0);
    pcVar8 = pcVar8 + -1;
  }
LAB_0046e440:
  *sourcep = pcVar8;
  piVar9 = &local_8c;
  iVar7 = (*this->_vptr_FParseContext[2])(this,&local_88,piVar9);
  if ((char)iVar7 == '\0') {
    bVar2 = FindSym(this,(char *)&local_88,&yylval->symval);
    if (bVar2) {
      yylval->val = yylval->symval->Value;
    }
    else {
      iVar7 = P_FindLineSpecial((char *)&local_88,(int *)0x0,(int *)0x0);
      yylval->val = iVar7;
      if (iVar7 == 0) {
        strcpy(yylval->sym,(char *)&local_88);
        piVar9 = this->TokenTrans + 0xd;
        goto LAB_0046e4eb;
      }
    }
    piVar9 = this->TokenTrans + 9;
  }
LAB_0046e4eb:
  return *piVar9;
}

Assistant:

int FParseContext::GetToken (char *&sourcep, FParseToken *yylval)
{
	char token[80];
	int toksize;
	int c;

loop:
	while (isspace (c = *sourcep++) && c != 0)
	{
		if (c == '\n')
			SourceLine++;
	}

	if (c == 0)
	{
		return 0;
	}
	if (isdigit (c))
	{
		int buildup = c - '0';
		if (c == '0')
		{
			c = *sourcep++;
			if (c == 'x' || c == 'X')
			{
				yylval->val = (int)strtol(sourcep, &sourcep, 16);
				return TokenTrans[NUM];
			}
			else
			{
				sourcep--;
			}
		}
		char *endp;

		sourcep--;
		yylval->val = (int)strtol(sourcep, &endp, 10);
		if (*endp == '.')
		{
			// It's a float
			yylval->fval = strtod(sourcep, &sourcep);
			return TokenTrans[FLOATVAL];
		}
		else
		{
			sourcep = endp;
			return TokenTrans[NUM];
		}
	}
	if (isalpha (c))
	{
		int buildup = 0;
		
		token[0] = c;
		toksize = 1;
		while (toksize < 79 && (isalnum (c = *sourcep++) || c == '_'))
		{
			token[toksize++] = c;
		}
		token[toksize] = 0;
		if (toksize == 79 && isalnum (c))
		{
			while (isalnum (c = *sourcep++))
				;
		}
		sourcep--;
		if (FindToken (token, &buildup))
		{
			return buildup;
		}
		if (FindSym (token, &yylval->symval))
		{
			yylval->val = yylval->symval->Value;
			return TokenTrans[NUM];
		}
		if ((yylval->val = P_FindLineSpecial(token)) != 0)
		{
			return TokenTrans[NUM];
		}
#if __GNUC__ == 4 && __GNUC_MINOR__ == 8
		// Work around GCC 4.8 bug 54570 causing release build crashes.
		asm("" : "+g" (yylval));
#endif
		strcpy (yylval->sym, token);
		return TokenTrans[SYM];
	}
	if (c == '/')
	{
		c = *sourcep++;
		if (c == '*')
		{
			for (;;)
			{
				while ((c = *sourcep++) != '*' && c != 0)
				{
					if (c == '\n')
						SourceLine++;
				}
				if (c == 0)
					return 0;
				if ((c = *sourcep++) == '/')
					goto loop;
				if (c == 0)
					return 0;
				sourcep--;
			}
		}
		else if (c == '/')
		{
			while ((c = *sourcep++) != '\n' && c != 0)
				;
			if (c == '\n')
				SourceLine++;
			else if (c == EOF)
				return 0;
			goto loop;
		}
		else
		{
			sourcep--;
			return TokenTrans[DIVIDE];
		}
	}
	if (c == '"')
	{
		int tokensize = 0;
		while ((c = *sourcep++) != '"' && c != 0)
		{
			yylval->string[tokensize++] = c;
		}
		yylval->string[tokensize] = 0;
		return TokenTrans[STRING];
	}
	if (c == '|')
	{
		c = *sourcep++;
		if (c == '=')
			return TokenTrans[OR_EQUAL];
		sourcep--;
		return TokenTrans[OR];
	}
	if (c == '<')
	{
		c = *sourcep++;
		if (c == '<')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[LSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '>')
	{
		c = *sourcep++;
		if (c == '>')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[RSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '#')
	{
		if (!strnicmp(sourcep, "include", 7))
		{
			sourcep+=7;
			return TokenTrans[INCLUDE];
		}
		if (!strnicmp(sourcep, "define", 6))
		{
			sourcep+=6;
			return TokenTrans[DEFINE];
		}
	}
	switch (c)
	{
	case '^': return TokenTrans[XOR];
	case '&': return TokenTrans[AND];
	case '-': return TokenTrans[MINUS];
	case '+': return TokenTrans[PLUS];
	case '*': return TokenTrans[MULTIPLY];
	case '%': return TokenTrans[MODULUS];
	case '(': return TokenTrans[LPAREN];
	case ')': return TokenTrans[RPAREN];
	case ',': return TokenTrans[COMMA];
	case '{': return TokenTrans[LBRACE];
	case '}': return TokenTrans[RBRACE];
	case '=': return TokenTrans[EQUALS];
	case ';': return TokenTrans[SEMICOLON];
	case ':': return TokenTrans[COLON];
	case '[': return TokenTrans[LBRACKET];
	case ']': return TokenTrans[RBRACKET];
	default:  return 0;
	}
}